

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t consume_optional_marker(archive_read *a,zip *zip)

{
  uint32_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uncompressed;
  uint64_t compressed;
  char *p;
  zip *zip_local;
  archive_read *a_local;
  
  if ((zip->end_of_entry != '\0') && ((zip->entry->zip_flags & 8) != 0)) {
    compressed = (uint64_t)__archive_read_ahead(a,0x18,(ssize_t *)0x0);
    if ((char *)compressed == (char *)0x0) {
      archive_set_error(&a->archive,0x54,"Truncated ZIP end-of-file record");
      return L'\xffffffe2';
    }
    if ((((*(char *)compressed == 'P') && (*(char *)(compressed + 1) == 'K')) &&
        (*(char *)(compressed + 2) == '\a')) && (*(char *)(compressed + 3) == '\b')) {
      compressed = compressed + 4;
      zip->unconsumed = 4;
    }
    if ((zip->entry->flags & 1) == 0) {
      uVar1 = archive_le32dec((void *)compressed);
      zip->entry->cm_zlib_crc32 = uVar1;
      uVar1 = archive_le32dec((void *)(compressed + 4));
      zip->entry->compressed_size = (ulong)uVar1;
      uVar1 = archive_le32dec((void *)(compressed + 8));
      zip->entry->uncompressed_size = (ulong)uVar1;
      zip->unconsumed = zip->unconsumed + 0xc;
    }
    else {
      uVar1 = archive_le32dec((void *)compressed);
      zip->entry->cm_zlib_crc32 = uVar1;
      uVar2 = archive_le64dec((void *)(compressed + 4));
      uVar3 = archive_le64dec((void *)(compressed + 0xc));
      if ((0x7fffffffffffffff < uVar2) || (0x7fffffffffffffff < uVar3)) {
        archive_set_error(&a->archive,0x54,"Overflow of 64-bit file sizes");
        return L'\xffffffe7';
      }
      zip->entry->compressed_size = uVar2;
      zip->entry->uncompressed_size = uVar3;
      zip->unconsumed = zip->unconsumed + 0x14;
    }
  }
  return L'\0';
}

Assistant:

static int
consume_optional_marker(struct archive_read *a, struct zip *zip)
{
	if (zip->end_of_entry && (zip->entry->zip_flags & ZIP_LENGTH_AT_END)) {
		const char *p;

		if (NULL == (p = __archive_read_ahead(a, 24, NULL))) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated ZIP end-of-file record");
			return (ARCHIVE_FATAL);
		}
		/* Consume the optional PK\007\010 marker. */
		if (p[0] == 'P' && p[1] == 'K' &&
		    p[2] == '\007' && p[3] == '\010') {
			p += 4;
			zip->unconsumed = 4;
		}
		if (zip->entry->flags & LA_USED_ZIP64) {
			uint64_t compressed, uncompressed;
			zip->entry->crc32 = archive_le32dec(p);
			compressed = archive_le64dec(p + 4);
			uncompressed = archive_le64dec(p + 12);
			if (compressed > INT64_MAX ||
			    uncompressed > INT64_MAX) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Overflow of 64-bit file sizes");
				return ARCHIVE_FAILED;
			}
			zip->entry->compressed_size = compressed;
			zip->entry->uncompressed_size = uncompressed;
			zip->unconsumed += 20;
		} else {
			zip->entry->crc32 = archive_le32dec(p);
			zip->entry->compressed_size = archive_le32dec(p + 4);
			zip->entry->uncompressed_size = archive_le32dec(p + 8);
			zip->unconsumed += 12;
		}
	}

    return (ARCHIVE_OK);
}